

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DProjGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  int i_1;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38 [8];
  
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar4 = c->textures[0].tex2D;
  fVar6 = (float)pTVar4->m_width;
  fVar7 = (float)pTVar4->m_height;
  lVar5 = 0;
  fVar6 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar6,c->in[1].m_data[1] * fVar7,
                     fVar6 * c->in[2].m_data[0],fVar7 * c->in[2].m_data[1]);
  local_48 = *(undefined8 *)(p->offset).m_data;
  pTVar4 = c->textures[0].tex2D;
  uStack_40 = (ulong)uStack_40._4_4_ << 0x20;
  tcu::sampleLevelArray2DOffset
            ((ConstPixelBufferAccess *)(local_38 + 4),(int)(pTVar4->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar4->m_view).m_numLevels,fVar2 / fVar1,fVar3 / fVar1,fVar6,
             (IVec3 *)c->textures);
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  local_38[2] = 0.0;
  local_38[3] = 0.0;
  do {
    local_38[lVar5] = local_38[lVar5 + 4] * (p->scale).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_48 = 0;
  uStack_40 = 0;
  lVar5 = 0;
  do {
    *(float *)((long)&local_48 + lVar5 * 4) = local_38[lVar5] + (p->bias).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  *(undefined8 *)(c->color).m_data = local_48;
  *(long *)((c->color).m_data + 2) = uStack_40;
  return;
}

Assistant:

static void		evalTexture2DProjGradOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c), p.offset.swizzle(0,1))*p.scale + p.bias; }